

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldIteratorTest_UninitializedIterator_Test::TestBody
          (RepeatedPtrFieldIteratorTest_UninitializedIterator_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1d0;
  AssertHelper local_1b0;
  Message local_1a8;
  iterator local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_160;
  Message local_158;
  void **local_150;
  iterator local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  void **local_f8;
  iterator local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b0;
  Message local_a8;
  void **local_a0;
  iterator local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58 [3];
  Message local_40;
  iterator local_38;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  iterator iter;
  RepeatedPtrFieldIteratorTest_UninitializedIterator_Test *this_local;
  
  internal::
  RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrIterator
            ((RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&gtest_ar_.message_);
  local_38.it_ = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::begin(&(this->super_RepeatedPtrFieldIteratorTest).proto_array_);
  local_29 = internal::operator!=((iterator *)&gtest_ar_.message_,&local_38);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_28,&local_29,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,
               (AssertionResult *)"iter != proto_array_.begin()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4fc,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_a0 = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::begin(&(this->super_RepeatedPtrFieldIteratorTest).proto_array_);
  local_98 = internal::operator+((iterator)local_a0,1);
  local_89 = internal::operator!=((iterator *)&gtest_ar_.message_,&local_98);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_88,
               (AssertionResult *)"iter != proto_array_.begin() + 1","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4fd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_f8 = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::begin(&(this->super_RepeatedPtrFieldIteratorTest).proto_array_);
  local_f0 = internal::operator+((iterator)local_f8,2);
  local_e1 = internal::operator!=((iterator *)&gtest_ar_.message_,&local_f0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_e0,
               (AssertionResult *)"iter != proto_array_.begin() + 2","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4fe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_150 = (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::begin(&(this->super_RepeatedPtrFieldIteratorTest).proto_array_);
  local_148 = internal::operator+((iterator)local_150,3);
  local_139 = internal::operator!=((iterator *)&gtest_ar_.message_,&local_148);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_138,
               (AssertionResult *)"iter != proto_array_.begin() + 3","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x4ff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  local_1a0.it_ =
       (void **)RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::end(&(this->super_RepeatedPtrFieldIteratorTest).proto_array_);
  local_191 = internal::operator!=((iterator *)&gtest_ar_.message_,&local_1a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d0,(internal *)local_190,(AssertionResult *)"iter != proto_array_.end()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field_unittest.cc"
               ,0x500,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldIteratorTest, UninitializedIterator) {
  RepeatedPtrField<std::string>::iterator iter;
  EXPECT_TRUE(iter != proto_array_.begin());
  EXPECT_TRUE(iter != proto_array_.begin() + 1);
  EXPECT_TRUE(iter != proto_array_.begin() + 2);
  EXPECT_TRUE(iter != proto_array_.begin() + 3);
  EXPECT_TRUE(iter != proto_array_.end());
}